

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)40,_(unsigned_short)19>::Unpack
               (uint32_t **in,uint64_t *out)

{
  uint32_t *puVar1;
  
  puVar1 = *in;
  out[0x13] = (ulong)*(uint5 *)((long)puVar1 + 3);
  *in = puVar1 + 2;
  Unroller<(unsigned_short)40,_(unsigned_short)20>::Unpack(in,out);
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}